

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TimerQueue.cpp
# Opt level: O0

void __thiscall sznet::TimerQueue::cancel(TimerQueue *this,TimerId timerId)

{
  EventLoop *this_00;
  TimerQueue *local_80;
  code *local_78;
  undefined8 local_70;
  type local_68;
  Functor local_40;
  TimerQueue *local_20;
  TimerQueue *this_local;
  TimerId timerId_local;
  
  timerId_local.m_timer = (Timer *)timerId.m_sequence;
  this_local = (TimerQueue *)timerId.m_timer;
  this_00 = this->m_loop;
  local_78 = cancelInLoop;
  local_70 = 0;
  local_80 = this;
  local_20 = this;
  std::bind<void(sznet::TimerQueue::*)(sznet::TimerId),sznet::TimerQueue*,sznet::TimerId&>
            (&local_68,(offset_in_TimerQueue_to_subr *)&local_78,&local_80,(TimerId *)&this_local);
  std::function<void()>::
  function<std::_Bind<void(sznet::TimerQueue::*(sznet::TimerQueue*,sznet::TimerId))(sznet::TimerId)>,void>
            ((function<void()> *)&local_40,&local_68);
  net::EventLoop::runInLoop(this_00,&local_40);
  std::function<void_()>::~function(&local_40);
  return;
}

Assistant:

void TimerQueue::cancel(TimerId timerId)
{
	m_loop->runInLoop(std::bind(&TimerQueue::cancelInLoop, this, timerId));
}